

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

int OptInit(char **a,s_options *o,FILE *err)

{
  int iVar1;
  char *pcVar2;
  FILE *in_RDX;
  s_options *in_RSI;
  FILE *in_RDI;
  int unaff_retaddr;
  int i;
  int errcnt;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  g_argv = (char **)in_RDI;
  op = in_RSI;
  errstream = (FILE *)in_RDX;
  if (((in_RDI != (FILE *)0x0) && (*(char **)in_RDI != (char *)0x0)) && (in_RSI != (s_options *)0x0)
     ) {
    for (local_20 = 1; g_argv[local_20] != (char *)0x0; local_20 = local_20 + 1) {
      if ((*g_argv[local_20] == '+') || (*g_argv[local_20] == '-')) {
        iVar1 = handleflags(unaff_retaddr,in_RDI);
        local_1c = iVar1 + local_1c;
      }
      else {
        pcVar2 = strchr(g_argv[local_20],0x3d);
        if (pcVar2 != (char *)0x0) {
          iVar1 = handleswitch(a._4_4_,(FILE *)o);
          local_1c = iVar1 + local_1c;
        }
      }
    }
  }
  if (local_1c < 1) {
    return 0;
  }
  fprintf(in_RDX,"Valid command line options for \"%s\" are:\n",*(char **)in_RDI);
  OptPrint();
  exit(1);
}

Assistant:

int OptInit(char **a, struct s_options *o, FILE *err)
{
  int errcnt = 0;
  g_argv = a;
  op = o;
  errstream = err;
  if( g_argv && *g_argv && op ){
    int i;
    for(i=1; g_argv[i]; i++){
      if( g_argv[i][0]=='+' || g_argv[i][0]=='-' ){
        errcnt += handleflags(i,err);
      }else if( strchr(g_argv[i],'=') ){
        errcnt += handleswitch(i,err);
      }
    }
  }
  if( errcnt>0 ){
    fprintf(err,"Valid command line options for \"%s\" are:\n",*a);
    OptPrint();
    exit(1);
  }
  return 0;
}